

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O0

char __thiscall string_view::operator[](string_view *this,size_t pos)

{
  out_of_range *this_00;
  char *pcVar1;
  long in_RSI;
  ulong *in_RDI;
  size_t index;
  
  if (in_RDI[2] <= in_RDI[1] + in_RSI) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"string_view index out of range");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  pcVar1 = (char *)std::__cxx11::string::operator[](*in_RDI);
  return *pcVar1;
}

Assistant:

char operator[](size_t pos) const {
        auto index = _start + pos;
        if (index >= _end) {
            throw std::out_of_range("string_view index out of range");
        }
        return _str[_start + pos];
    }